

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mp3_generate_seek_table
                    (ma_mp3 *pMP3,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_uint32 seekPointCount_00;
  ma_bool32 mVar1;
  long in_RSI;
  long in_RDI;
  ma_dr_mp3_seek_point *pSeekPoints;
  ma_uint32 seekPointCount;
  ma_bool32 mp3Result;
  ma_dr_mp3_seek_point *in_stack_00000058;
  ma_uint32 *in_stack_00000060;
  ma_dr_mp3 *in_stack_00000068;
  ma_allocation_callbacks *in_stack_ffffffffffffffc8;
  ma_dr_mp3_seek_point *pSeekPoints_00;
  ma_result local_4;
  
  pSeekPoints_00 = (ma_dr_mp3_seek_point *)0x0;
  seekPointCount_00 = *(ma_uint32 *)(in_RSI + 4);
  if ((seekPointCount_00 == 0) ||
     (pSeekPoints_00 =
           (ma_dr_mp3_seek_point *)
           ma_malloc((size_t)in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x268e59),
     pSeekPoints_00 != (ma_dr_mp3_seek_point *)0x0)) {
    mVar1 = ma_dr_mp3_calculate_seek_points(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (mVar1 == 1) {
      mVar1 = ma_dr_mp3_bind_seek_table
                        ((ma_dr_mp3 *)(in_RDI + 0x70),seekPointCount_00,pSeekPoints_00);
      if (mVar1 == 1) {
        *(ma_uint32 *)(in_RDI + 0x3f30) = seekPointCount_00;
        *(ma_dr_mp3_seek_point **)(in_RDI + 0x3f38) = pSeekPoints_00;
        local_4 = MA_SUCCESS;
      }
      else {
        ma_free(pSeekPoints_00,in_stack_ffffffffffffffc8);
        local_4 = MA_ERROR;
      }
    }
    else {
      ma_free(pSeekPoints_00,in_stack_ffffffffffffffc8);
      local_4 = MA_ERROR;
    }
  }
  else {
    local_4 = MA_OUT_OF_MEMORY;
  }
  return local_4;
}

Assistant:

static ma_result ma_mp3_generate_seek_table(ma_mp3* pMP3, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 mp3Result;
    ma_uint32 seekPointCount = 0;
    ma_dr_mp3_seek_point* pSeekPoints = NULL;

    MA_ASSERT(pMP3    != NULL);
    MA_ASSERT(pConfig != NULL);

    seekPointCount = pConfig->seekPointCount;
    if (seekPointCount > 0) {
        pSeekPoints = (ma_dr_mp3_seek_point*)ma_malloc(sizeof(*pMP3->pSeekPoints) * seekPointCount, pAllocationCallbacks);
        if (pSeekPoints == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    }

    mp3Result = ma_dr_mp3_calculate_seek_points(&pMP3->dr, &seekPointCount, pSeekPoints);
    if (mp3Result != MA_TRUE) {
        ma_free(pSeekPoints, pAllocationCallbacks);
        return MA_ERROR;
    }

    mp3Result = ma_dr_mp3_bind_seek_table(&pMP3->dr, seekPointCount, pSeekPoints);
    if (mp3Result != MA_TRUE) {
        ma_free(pSeekPoints, pAllocationCallbacks);
        return MA_ERROR;
    }

    pMP3->seekPointCount = seekPointCount;
    pMP3->pSeekPoints    = pSeekPoints;

    return MA_SUCCESS;
}